

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Var> * __thiscall asl::Array<asl::Var>::insert(Array<asl::Var> *this,int k,Var *x)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  Var *pVVar4;
  Var *pVVar5;
  undefined8 *puVar6;
  Type TVar7;
  int iVar8;
  
  pVVar5 = this->_a;
  TVar1 = pVVar5[-1]._type;
  iVar2 = *(int *)&pVVar5[-1].field_0x4;
  TVar7 = k;
  if (k < 0) {
    TVar7 = TVar1;
  }
  if ((int)TVar1 < iVar2) {
    pVVar4 = pVVar5 + -1;
LAB_001302d9:
    if (TVar1 - TVar7 != 0 && (int)TVar7 <= (int)TVar1) {
      memmove(pVVar5 + (long)(int)TVar7 + 1,pVVar5 + (int)TVar7,(long)(int)(TVar1 - TVar7) << 4);
      pVVar5 = this->_a;
    }
    Var::Var(pVVar5 + (int)TVar7,x);
    pVVar4->_type = TVar1 + NUL;
    return this;
  }
  if (TVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = this->_a[-1].field_1._i;
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    pVVar4 = (Var *)realloc(this->_a + -1,(long)iVar8 * 0x10 + 0x10);
    if (pVVar4 != (Var *)0x0) {
      pVVar5 = pVVar4 + 1;
      this->_a = pVVar5;
      *(int *)&pVVar4->field_0x4 = iVar8;
      (pVVar4->field_1)._i = iVar3;
      goto LAB_001302d9;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}